

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

TypeNames * __thiscall
wasm::DefaultTypeNameGenerator::getNames
          (TypeNames *__return_storage_ptr__,DefaultTypeNameGenerator *this,HeapType type)

{
  ulong uVar1;
  HeapTypeKind HVar2;
  ostream *poVar3;
  pointer ppVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>,_bool>
  pVar5;
  string local_2e8;
  TypeNames local_2c8;
  stringstream local_280 [8];
  stringstream stream;
  ostream local_270 [376];
  type_conflict1 *local_f8;
  type_conflict1 *inserted;
  type *it;
  undefined1 local_e0;
  TypeNames local_c8;
  pair<const_wasm::HeapType,_wasm::TypeNames> local_80;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>,_bool>
  local_30;
  DefaultTypeNameGenerator *local_20;
  DefaultTypeNameGenerator *this_local;
  HeapType type_local;
  
  local_20 = this;
  this_local = (DefaultTypeNameGenerator *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  wasm::Name::Name(&local_c8.name);
  local_c8.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_c8.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
  local_c8.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8.fieldNames._M_h._M_element_count = 0;
  local_c8.fieldNames._M_h._M_buckets = (__buckets_ptr)0x0;
  local_c8.fieldNames._M_h._M_bucket_count = 0;
  local_c8.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&local_c8.fieldNames);
  std::pair<const_wasm::HeapType,_wasm::TypeNames>::pair<wasm::HeapType_&,_true>
            (&local_80,(HeapType *)&this_local,&local_c8);
  pVar5 = std::
          unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
          ::insert(&this->nameCache,&local_80);
  it = (type *)pVar5.first.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
               _M_cur;
  local_e0 = pVar5.second;
  local_30.first.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
  _M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
           (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)it;
  local_30.second = (bool)local_e0;
  std::pair<const_wasm::HeapType,_wasm::TypeNames>::~pair(&local_80);
  TypeNames::~TypeNames(&local_c8);
  inserted = (type_conflict1 *)
             std::
             get<0ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,wasm::TypeNames>,false,true>,bool>
                       (&local_30);
  local_f8 = std::
             get<1ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,wasm::TypeNames>,false,true>,bool>
                       (&local_30);
  if ((*local_f8 & 1U) != 0) {
    std::__cxx11::stringstream::stringstream(local_280);
    HVar2 = HeapType::getKind((HeapType *)&this_local);
    switch(HVar2) {
    case Basic:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x57e);
    case Func:
      poVar3 = std::operator<<(local_270,"func.");
      uVar1 = this->funcCount;
      this->funcCount = uVar1 + 1;
      std::ostream::operator<<(poVar3,uVar1);
      break;
    case Struct:
      poVar3 = std::operator<<(local_270,"struct.");
      uVar1 = this->structCount;
      this->structCount = uVar1 + 1;
      std::ostream::operator<<(poVar3,uVar1);
      break;
    case Array:
      poVar3 = std::operator<<(local_270,"array.");
      uVar1 = this->arrayCount;
      this->arrayCount = uVar1 + 1;
      std::ostream::operator<<(poVar3,uVar1);
      break;
    case Cont:
      poVar3 = std::operator<<(local_270,"cont.");
      uVar1 = this->contCount;
      this->contCount = uVar1 + 1;
      std::ostream::operator<<(poVar3,uVar1);
    }
    std::__cxx11::stringstream::str();
    wasm::Name::Name(&local_2c8.name,&local_2e8);
    local_2c8.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_2c8.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
    local_2c8.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
    local_2c8.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2c8.fieldNames._M_h._M_element_count = 0;
    local_2c8.fieldNames._M_h._M_buckets = (__buckets_ptr)0x0;
    local_2c8.fieldNames._M_h._M_bucket_count = 0;
    local_2c8.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
    ::unordered_map(&local_2c8.fieldNames);
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                         *)inserted);
    TypeNames::operator=(&ppVar4->second,&local_2c8);
    TypeNames::~TypeNames(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::stringstream::~stringstream(local_280);
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::operator->
                     ((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                       *)inserted);
  TypeNames::TypeNames(__return_storage_ptr__,&ppVar4->second);
  return __return_storage_ptr__;
}

Assistant:

TypeNames DefaultTypeNameGenerator::getNames(HeapType type) {
  auto [it, inserted] = nameCache.insert({type, {}});
  if (inserted) {
    // Generate a new name for this type we have not previously seen.
    std::stringstream stream;
    switch (type.getKind()) {
      case HeapTypeKind::Func:
        stream << "func." << funcCount++;
        break;
      case HeapTypeKind::Struct:
        stream << "struct." << structCount++;
        break;
      case HeapTypeKind::Array:
        stream << "array." << arrayCount++;
        break;
      case HeapTypeKind::Cont:
        stream << "cont." << contCount++;
        break;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
    it->second = {stream.str(), {}};
  }
  return it->second;
}